

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

type_of_iterator * __thiscall
roaring::Roaring64MapSetBitBiDirectionalIterator::operator++
          (Roaring64MapSetBitBiDirectionalIterator *this)

{
  _Base_ptr p_Var1;
  
  if ((this->i).has_value == true) {
    roaring_uint32_iterator_advance((roaring_uint32_iterator_t *)&this->i);
  }
  if ((this->i).has_value == false) {
    do {
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment((this->map_iter)._M_node);
      (this->map_iter)._M_node = p_Var1;
      if ((_Rb_tree_header *)p_Var1 == &(this->p->_M_t)._M_impl.super__Rb_tree_header) {
        return this;
      }
      roaring_iterator_init
                ((roaring_bitmap_t *)&p_Var1[1]._M_parent,(roaring_uint32_iterator_t *)&this->i);
    } while ((this->i).has_value != true);
  }
  return this;
}

Assistant:

type_of_iterator &operator++() {  // ++i, must returned inc. value
        if (i.has_value == true) roaring_uint32_iterator_advance(&i);
        while (!i.has_value) {
            ++map_iter;
            if (map_iter == p->cend()) return *this;
            roaring_iterator_init(&map_iter->second.roaring, &i);
        }
        return *this;
    }